

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O1

void __thiscall
EnvironmentNAVXYTHETALATTICE::DeprecatedPrecomputeActions(EnvironmentNAVXYTHETALATTICE *this)

{
  undefined8 *puVar1;
  undefined2 uVar2;
  EnvNAVXYTHETALATAction_t *pEVar3;
  long lVar4;
  pointer psVar5;
  pointer psVar6;
  undefined1 auVar7 [16];
  double __x;
  double dVar8;
  sbpl_xy_theta_pt_t pose;
  sbpl_xy_theta_pt_t pose_00;
  sbpl_xy_theta_pt_t pose_01;
  ulong uVar9;
  EnvNAVXYTHETALATAction_t **ppEVar10;
  ulong *puVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  char cVar18;
  ulong uVar19;
  ulong uVar20;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined1 uVar22;
  undefined1 auVar21 [16];
  double dVar23;
  double dVar24;
  EnvNAVXYTHETALATAction_t *local_138;
  pointer *local_130;
  double local_128;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *local_120;
  undefined8 local_118;
  double local_110;
  double local_108;
  double dStack_100;
  undefined8 local_f8;
  double local_f0;
  double dStack_e8;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_d8;
  double local_c0;
  double dStack_b8;
  undefined8 local_b0;
  double local_a8;
  double dStack_a0;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_90;
  double local_78;
  double dStack_70;
  undefined8 local_68;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_60;
  double local_48;
  double dStack_40;
  
  iVar17 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
  uVar19 = (ulong)iVar17;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar19;
  uVar9 = SUB168(auVar21 * ZEXT816(0x18),0);
  uVar20 = uVar9 + 8;
  if (0xfffffffffffffff7 < uVar9) {
    uVar20 = 0xffffffffffffffff;
  }
  if (SUB168(auVar21 * ZEXT816(0x18),8) != 0) {
    uVar20 = 0xffffffffffffffff;
  }
  uVar9 = uVar19 * 8;
  if (iVar17 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  ppEVar10 = (EnvNAVXYTHETALATAction_t **)operator_new__(uVar9);
  (this->EnvNAVXYTHETALATCfg).ActionsV = ppEVar10;
  puVar11 = (ulong *)operator_new__(uVar20);
  *puVar11 = uVar19;
  if (iVar17 != 0) {
    memset((vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
           (puVar11 + 1),0,((uVar19 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  (this->EnvNAVXYTHETALATCfg).PredActionsV =
       (vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
       (puVar11 + 1);
  if (0 < (this->EnvNAVXYTHETALATCfg).NumThetaDirs) {
    local_130 = &local_60.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    local_120 = &(this->EnvNAVXYTHETALATCfg).FootprintPolygon;
    iVar17 = -1;
    uVar9 = 0;
    do {
      uVar15 = (ulong)(this->EnvNAVXYTHETALATCfg).actionwidth;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar15;
      uVar19 = SUB168(auVar7 * ZEXT816(0x68),0);
      uVar20 = uVar19 + 8;
      if (0xfffffffffffffff7 < uVar19) {
        uVar20 = 0xffffffffffffffff;
      }
      if (SUB168(auVar7 * ZEXT816(0x68),8) != 0) {
        uVar20 = 0xffffffffffffffff;
      }
      puVar11 = (ulong *)operator_new__(uVar20);
      *puVar11 = uVar15;
      if (uVar15 != 0) {
        lVar16 = 0;
        do {
          puVar1 = (undefined8 *)((long)puVar11 + lVar16 + 0x48);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)puVar11 + lVar16 + 0x38);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)puVar11 + lVar16 + 0x28);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)puVar11 + lVar16 + 0x18);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)puVar11 + lVar16 + 0x58) = 0;
          lVar16 = lVar16 + 0x68;
        } while (uVar15 * 0x68 - lVar16 != 0);
      }
      (this->EnvNAVXYTHETALATCfg).ActionsV[uVar9] = (EnvNAVXYTHETALATAction_t *)(puVar11 + 1);
      dVar24 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
      local_110 = dVar24 * 0.0 + dVar24 * 0.5;
      (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])
                (this,uVar9 & 0xffffffff);
      local_118 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      lVar16 = 0;
      iVar14 = 0;
      do {
        pEVar3 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar9];
        (&pEVar3->aind)[lVar16] = (uchar)iVar14;
        cVar18 = (char)uVar9;
        (&pEVar3->starttheta)[lVar16] = cVar18;
        cVar12 = (char)((iVar17 + iVar14) % (this->EnvNAVXYTHETALATCfg).NumThetaDirs);
        (&pEVar3->endtheta)[lVar16] = cVar12;
        (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])
                  (this,(ulong)(uint)(int)cVar12);
        __x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        dVar24 = cos((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        dVar23 = cos(__x);
        (&(this->EnvNAVXYTHETALATCfg).ActionsV[uVar9]->dX)[lVar16] =
             (char)(int)(dVar24 + *(double *)(&DAT_001476f0 + (ulong)(0.0 < dVar23) * 8));
        dVar24 = sin(__x);
        dVar23 = sin(__x);
        pEVar3 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar9];
        cVar12 = (char)(int)(dVar24 + *(double *)(&DAT_001476f0 + (ulong)(0.0 < dVar23) * 8));
        (&pEVar3->dY)[lVar16] = cVar12;
        dVar24 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
        dVar23 = (this->EnvNAVXYTHETALATCfg).nominalvel_mpersecs;
        iVar13 = (int)(&pEVar3->dX)[lVar16];
        dVar8 = (double)((int)cVar12 * (int)cVar12 + iVar13 * iVar13);
        if (dVar8 < 0.0) {
          dVar8 = sqrt(dVar8);
        }
        else {
          dVar8 = SQRT(dVar8);
        }
        dVar24 = ceil(((dVar24 * 1000.0) / dVar23) * dVar8);
        ppEVar10 = (this->EnvNAVXYTHETALATCfg).ActionsV;
        pEVar3 = ppEVar10[uVar9];
        *(int *)((long)&pEVar3->cost + lVar16) = (int)dVar24;
        dVar24 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
        uVar2 = *(undefined2 *)(&pEVar3->dX + lVar16);
        lVar4 = *(long *)((long)&(pEVar3->intermptV).
                                 super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar16);
        if (*(long *)((long)&(pEVar3->intermptV).
                             super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish + lVar16) != lVar4) {
          *(long *)((long)&(pEVar3->intermptV).
                           super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish + lVar16) = lVar4;
        }
        pEVar3 = ppEVar10[uVar9];
        lVar4 = *(long *)((long)&(pEVar3->intersectingcellsV).
                                 super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar16);
        if (*(long *)((long)&(pEVar3->intersectingcellsV).
                             super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                             _M_impl.super__Vector_impl_data._M_finish + lVar16) != lVar4) {
          *(long *)((long)&(pEVar3->intersectingcellsV).
                           super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl
                           .super__Vector_impl_data._M_finish + lVar16) = lVar4;
        }
        uVar22 = (undefined1)((ushort)uVar2 >> 8);
        auVar21 = ZEXT416(CONCAT22((short)(CONCAT13(uVar22,CONCAT12(uVar22,uVar2)) >> 0x10),
                                   CONCAT11((char)uVar2,(char)uVar2)));
        auVar21 = pshuflw(auVar21,auVar21,0x60);
        dVar23 = dVar24 * 0.5 + dVar24 * (double)(auVar21._0_4_ >> 0x18);
        dVar24 = dVar24 * 0.5 + dVar24 * (double)(auVar21._4_4_ >> 0x18);
        std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector(&local_60,local_120);
        pose.y._0_4_ = SUB84(dVar24,0);
        pose.x = dVar23;
        pose.y._4_4_ = (int)((ulong)dVar24 >> 0x20);
        pose.theta = __x;
        local_48 = dVar23;
        dStack_40 = dVar24;
        get_2d_footprint_cells
                  (&local_60,
                   (vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)
                   ((long)&((this->EnvNAVXYTHETALATCfg).ActionsV[uVar9]->intersectingcellsV).
                           super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar16),pose,
                   (this->EnvNAVXYTHETALATCfg).cellsize_m);
        if (local_60.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_78 = local_110;
        dStack_70 = local_110;
        local_68 = local_118;
        (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x44])
                  (this,(long)&((this->EnvNAVXYTHETALATCfg).ActionsV[uVar9]->intersectingcellsV).
                               super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar16);
        ppEVar10 = (this->EnvNAVXYTHETALATCfg).ActionsV;
        iVar13 = (int)(&ppEVar10[uVar9]->endtheta)[lVar16];
        local_138 = (EnvNAVXYTHETALATAction_t *)(&ppEVar10[uVar9]->aind + lVar16);
        std::vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>::
        emplace_back<EnvNAVXYTHETALATAction_t*>
                  ((vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *)
                   ((this->EnvNAVXYTHETALATCfg).PredActionsV +
                   ((iVar13 >> 0x1f & (this->EnvNAVXYTHETALATCfg).NumThetaDirs) + iVar13)),
                   &local_138);
        iVar14 = iVar14 + 1;
        lVar16 = lVar16 + 0x68;
      } while (lVar16 != 0x138);
      pEVar3 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar9];
      pEVar3[3].aind = '\x03';
      pEVar3[3].starttheta = cVar18;
      cVar12 = cVar18 + -1;
      pEVar3[3].endtheta = cVar12;
      if (cVar12 < '\0') {
        pEVar3[3].endtheta = cVar12 + (char)(this->EnvNAVXYTHETALATCfg).NumThetaDirs;
      }
      pEVar3[3].dX = '\0';
      pEVar3[3].dY = '\0';
      pEVar3[3].cost = (int)((this->EnvNAVXYTHETALATCfg).timetoturn45degsinplace_secs * 1000.0);
      dVar24 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
      local_128 = dVar24 * 0.5;
      (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])
                (this,(ulong)(uint)(int)pEVar3[3].endtheta);
      pose_00.theta._4_4_ = extraout_XMM0_Db_01;
      pose_00.theta._0_4_ = extraout_XMM0_Da_01;
      ppEVar10 = (this->EnvNAVXYTHETALATCfg).ActionsV;
      pEVar3 = ppEVar10[uVar9];
      psVar5 = pEVar3[3].intermptV.
               super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pEVar3[3].intermptV.
          super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
          super__Vector_impl_data._M_finish != psVar5) {
        pEVar3[3].intermptV.
        super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
        super__Vector_impl_data._M_finish = psVar5;
      }
      pEVar3 = ppEVar10[uVar9];
      psVar6 = pEVar3[3].intersectingcellsV.
               super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pEVar3[3].intersectingcellsV.
          super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
          super__Vector_impl_data._M_finish != psVar6) {
        pEVar3[3].intersectingcellsV.
        super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
        super__Vector_impl_data._M_finish = psVar6;
      }
      dVar24 = dVar24 * 0.0 + local_128;
      std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector(&local_90,local_120);
      pose_00.y._0_4_ = SUB84(dVar24,0);
      pose_00.x = dVar24;
      pose_00.y._4_4_ = (int)((ulong)dVar24 >> 0x20);
      local_a8 = dVar24;
      dStack_a0 = dVar24;
      get_2d_footprint_cells
                (&local_90,&(this->EnvNAVXYTHETALATCfg).ActionsV[uVar9][3].intersectingcellsV,
                 pose_00,(this->EnvNAVXYTHETALATCfg).cellsize_m);
      if (local_90.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_c0 = local_110;
      dStack_b8 = local_110;
      local_b0 = local_118;
      (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x44])
                (this,&(this->EnvNAVXYTHETALATCfg).ActionsV[uVar9][3].intersectingcellsV);
      ppEVar10 = (this->EnvNAVXYTHETALATCfg).ActionsV;
      iVar14 = (int)ppEVar10[uVar9][3].endtheta;
      local_138 = ppEVar10[uVar9] + 3;
      std::vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>::
      emplace_back<EnvNAVXYTHETALATAction_t*>
                ((vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *)
                 ((this->EnvNAVXYTHETALATCfg).PredActionsV +
                 ((iVar14 >> 0x1f & (this->EnvNAVXYTHETALATCfg).NumThetaDirs) + iVar14)),&local_138)
      ;
      pEVar3 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar9];
      pEVar3[4].aind = '\x04';
      pEVar3[4].starttheta = cVar18;
      uVar19 = uVar9 + 1;
      cVar12 = (char)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) %
                     (long)(this->EnvNAVXYTHETALATCfg).NumThetaDirs);
      pEVar3[4].endtheta = cVar12;
      pEVar3[4].dX = '\0';
      pEVar3[4].dY = '\0';
      pEVar3[4].cost = (int)((this->EnvNAVXYTHETALATCfg).timetoturn45degsinplace_secs * 1000.0);
      dVar24 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
      local_128 = dVar24 * 0.5;
      (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])
                (this,(ulong)(uint)(int)cVar12);
      pose_01.theta._4_4_ = extraout_XMM0_Db_02;
      pose_01.theta._0_4_ = extraout_XMM0_Da_02;
      ppEVar10 = (this->EnvNAVXYTHETALATCfg).ActionsV;
      pEVar3 = ppEVar10[uVar9];
      psVar5 = pEVar3[4].intermptV.
               super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pEVar3[4].intermptV.
          super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
          super__Vector_impl_data._M_finish != psVar5) {
        pEVar3[4].intermptV.
        super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
        super__Vector_impl_data._M_finish = psVar5;
      }
      pEVar3 = ppEVar10[uVar9];
      psVar6 = pEVar3[4].intersectingcellsV.
               super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pEVar3[4].intersectingcellsV.
          super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
          super__Vector_impl_data._M_finish != psVar6) {
        pEVar3[4].intersectingcellsV.
        super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
        super__Vector_impl_data._M_finish = psVar6;
      }
      dVar24 = dVar24 * 0.0 + local_128;
      std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector(&local_d8,local_120);
      pose_01.y._0_4_ = SUB84(dVar24,0);
      pose_01.x = dVar24;
      pose_01.y._4_4_ = (int)((ulong)dVar24 >> 0x20);
      local_f0 = dVar24;
      dStack_e8 = dVar24;
      get_2d_footprint_cells
                (&local_d8,&(this->EnvNAVXYTHETALATCfg).ActionsV[uVar9][4].intersectingcellsV,
                 pose_01,(this->EnvNAVXYTHETALATCfg).cellsize_m);
      if (local_d8.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_108 = local_110;
      dStack_100 = local_110;
      local_f8 = local_118;
      (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x44])
                (this,&(this->EnvNAVXYTHETALATCfg).ActionsV[uVar9][4].intersectingcellsV);
      ppEVar10 = (this->EnvNAVXYTHETALATCfg).ActionsV;
      iVar14 = (int)ppEVar10[uVar9][4].endtheta;
      local_138 = ppEVar10[uVar9] + 4;
      std::vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>::
      emplace_back<EnvNAVXYTHETALATAction_t*>
                ((vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *)
                 ((this->EnvNAVXYTHETALATCfg).PredActionsV +
                 ((iVar14 >> 0x1f & (this->EnvNAVXYTHETALATCfg).NumThetaDirs) + iVar14)),&local_138)
      ;
      iVar17 = iVar17 + 1;
      uVar9 = uVar19;
    } while ((long)uVar19 < (long)(this->EnvNAVXYTHETALATCfg).NumThetaDirs);
  }
  (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x4b])(this);
  return;
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::DeprecatedPrecomputeActions()
{
    SBPL_PRINTF("Use of DeprecatedPrecomputeActions() is deprecated and probably doesn't work!\n");

    // construct list of actions
    SBPL_PRINTF("Pre-computing action data using the motion primitives for a 3D kinematic planning...\n");
    EnvNAVXYTHETALATCfg.ActionsV = new EnvNAVXYTHETALATAction_t*[EnvNAVXYTHETALATCfg.NumThetaDirs];
    EnvNAVXYTHETALATCfg.PredActionsV = new std::vector<EnvNAVXYTHETALATAction_t*> [EnvNAVXYTHETALATCfg.NumThetaDirs];
    std::vector<sbpl_2Dcell_t> footprint;
    // iterate over source angles
    for (int tind = 0; tind < EnvNAVXYTHETALATCfg.NumThetaDirs; tind++) {
        SBPL_PRINTF("processing angle %d\n", tind);
        EnvNAVXYTHETALATCfg.ActionsV[tind] = new EnvNAVXYTHETALATAction_t[EnvNAVXYTHETALATCfg.actionwidth];

        // compute sourcepose
        sbpl_xy_theta_pt_t sourcepose;
        sourcepose.x = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
        sourcepose.y = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
        sourcepose.theta = DiscTheta2ContNew(tind);

        // the construction assumes that the robot first turns and then goes
        // along this new theta
        int aind = 0;
        for (; aind < 3; aind++) {
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
            // -1,0,1
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = (tind + aind - 1) % EnvNAVXYTHETALATCfg.NumThetaDirs;
            double angle = DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta);
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = (int)(cos(angle) + 0.5 * (cos(angle) > 0 ? 1 : -1));
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = (int)(sin(angle) + 0.5 * (sin(angle) > 0 ? 1 : -1));
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost = (int)(ceil(NAVXYTHETALAT_COSTMULT_MTOMM *
                    EnvNAVXYTHETALATCfg.cellsize_m / EnvNAVXYTHETALATCfg.nominalvel_mpersecs *
                    sqrt((double)(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX *
                            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX + EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY *
                            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY))));

            // compute intersecting cells
            sbpl_xy_theta_pt_t pose;
            pose.x = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.cellsize_m);
            pose.y = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY, EnvNAVXYTHETALATCfg.cellsize_m);
            pose.theta = angle;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
            get_2d_footprint_cells(
                    EnvNAVXYTHETALATCfg.FootprintPolygon,
                    &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                    pose,
                    EnvNAVXYTHETALATCfg.cellsize_m);
            RemoveSourceFootprint(sourcepose, &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV);

#if DEBUG
            SBPL_PRINTF("action tind=%d aind=%d: endtheta=%d (%f) dX=%d dY=%d cost=%d\n",
                        tind, aind, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta, angle,
                        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost);
#endif

            // add to the list of backward actions
            int targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
            if (targettheta < 0) {
                targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
            }
            EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));
        }

        // decrease and increase angle without movement
        aind = 3;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = tind - 1;
        if (EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta < 0) {
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta += EnvNAVXYTHETALATCfg.NumThetaDirs;
        }
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost =
                (int)(NAVXYTHETALAT_COSTMULT_MTOMM * EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs);

        // compute intersecting cells
        sbpl_xy_theta_pt_t pose;
        pose.x = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.y = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.theta = DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta);
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
        get_2d_footprint_cells(
                EnvNAVXYTHETALATCfg.FootprintPolygon,
                &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                pose,
                EnvNAVXYTHETALATCfg.cellsize_m);
        RemoveSourceFootprint(sourcepose, &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV);

#if DEBUG
        SBPL_PRINTF("action tind=%d aind=%d: endtheta=%d (%f) dX=%d dY=%d cost=%d\n",
                    tind, aind, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta,
                    DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta),
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost);
#endif

        // add to the list of backward actions
        int targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
        if (targettheta < 0) {
            targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
        }
        EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));

        aind = 4;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = (tind + 1) % EnvNAVXYTHETALATCfg.NumThetaDirs;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost =
                (int)(NAVXYTHETALAT_COSTMULT_MTOMM * EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs);

        // compute intersecting cells
        pose.x = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.y = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.theta = DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta);
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
        get_2d_footprint_cells(
                EnvNAVXYTHETALATCfg.FootprintPolygon,
                &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                pose,
                EnvNAVXYTHETALATCfg.cellsize_m);
        RemoveSourceFootprint(sourcepose, &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV);

#if DEBUG
        SBPL_PRINTF("action tind=%d aind=%d: endtheta=%d (%f) dX=%d dY=%d cost=%d\n",
                    tind, aind, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta, DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta),
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost);
#endif

        // add to the list of backward actions
        targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
        if (targettheta < 0) targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
        EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));
    }

    // now compute replanning data
    ComputeReplanningData();

    SBPL_PRINTF("done pre-computing action data\n");
}